

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerNSC::ArchiveOUT(ChContactContainerNSC *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChContactContainerNSC>(marchive);
  ChContactContainer::ArchiveOUT(&this->super_ChContactContainer,marchive);
  return;
}

Assistant:

void ChContactContainerNSC::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChContactContainerNSC>();
    // serialize parent class
    ChContactContainer::ArchiveOUT(marchive);
    // serialize all member data:
    // NO SERIALIZATION of contact list because assume it is volatile and generated when needed
}